

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treelstm.cc
# Opt level: O2

Expression __thiscall
dynet::NaryTreeLSTMBuilder::add_input
          (NaryTreeLSTMBuilder *this,int id,vector<int,_std::allocator<int>_> *children,
          Expression *x)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  pointer pvVar4;
  int *piVar5;
  pointer pEVar6;
  VariableIndex VVar7;
  pointer pvVar8;
  ComputationGraph *extraout_RAX;
  undefined8 extraout_RDX;
  uint k;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  iterator __begin3;
  int *piVar14;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar18;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar19;
  undefined4 extraout_XMM0_Db_01;
  initializer_list<dynet::Expression> __l;
  initializer_list<dynet::Expression> __l_00;
  initializer_list<dynet::Expression> __l_01;
  initializer_list<dynet::Expression> __l_02;
  Expression EVar20;
  Expression i_ot;
  allocator_type local_131;
  Expression ph_t;
  Expression local_118;
  ulong local_100;
  Expression i_crt;
  Expression in;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> i_ft;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> i_h_children;
  vector<dynet::Expression,_std::allocator<dynet::Expression>_> i_c_children;
  Expression local_78;
  pointer local_68;
  Expression i_wt;
  Expression i_it;
  
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&i_ot,
             (ulong)this->layers,(allocator_type *)&i_h_children);
  std::
  vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
  ::emplace_back<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
            ((vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
              *)&this->h,(vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&i_ot);
  std::_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>::~_Vector_base
            ((_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_> *)&i_ot);
  std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&i_ot,
             (ulong)this->layers,(allocator_type *)&i_h_children);
  std::
  vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
  ::emplace_back<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
            ((vector<std::vector<dynet::Expression,std::allocator<dynet::Expression>>,std::allocator<std::vector<dynet::Expression,std::allocator<dynet::Expression>>>>
              *)&this->c,(vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&i_ot);
  std::_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>::~_Vector_base
            ((_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_> *)&i_ot);
  local_68 = (this->h).
             super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  pvVar4 = (this->c).
           super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (uVar10 = 0; uVar10 < this->layers; uVar10 = uVar10 + 1) {
    pvVar8 = (this->param_vars).
             super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + uVar10;
    i_h_children.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    i_h_children.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    i_h_children.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    i_c_children.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    i_c_children.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    i_c_children.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    lVar11 = (long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::reserve
              (&i_h_children,lVar11 + (ulong)(lVar11 == 0));
    lVar11 = (long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::reserve
              (&i_c_children,lVar11 + (ulong)(lVar11 == 0));
    piVar14 = (children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start;
    piVar5 = (children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    bVar1 = this->has_initial_state;
    bVar17 = piVar5 == piVar14;
    local_100 = uVar10;
    if (bVar17) {
      i_ot = (Expression)ZEXT816(0);
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::
      emplace_back<dynet::Expression>(&i_h_children,&i_ot);
      i_ot = (Expression)ZEXT816(0);
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::
      emplace_back<dynet::Expression>(&i_c_children,&i_ot);
      if (this->has_initial_state == true) {
        pEVar6 = (this->h0).
                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar10;
        VVar7 = pEVar6->i;
        uVar12 = pEVar6->graph_id;
        (i_h_children.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
         _M_impl.super__Vector_impl_data._M_start)->pg = pEVar6->pg;
        (i_h_children.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
         _M_impl.super__Vector_impl_data._M_start)->i = VVar7;
        (i_h_children.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
         _M_impl.super__Vector_impl_data._M_start)->graph_id = uVar12;
        pEVar6 = (this->c0).
                 super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar10;
        VVar7 = pEVar6->i;
        uVar12 = pEVar6->graph_id;
        (i_c_children.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
         _M_impl.super__Vector_impl_data._M_start)->pg = pEVar6->pg;
        (i_c_children.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
         _M_impl.super__Vector_impl_data._M_start)->i = VVar7;
        (i_c_children.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
         _M_impl.super__Vector_impl_data._M_start)->graph_id = uVar12;
      }
    }
    else {
      for (; uVar10 = local_100, piVar14 != piVar5; piVar14 = piVar14 + 1) {
        iVar2 = *piVar14;
        lVar11 = local_100 * 0x10;
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                  (&i_h_children,
                   (value_type *)
                   (*(long *)&(this->h).
                              super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar2].
                              super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                              ._M_impl + lVar11));
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                  (&i_c_children,
                   (value_type *)
                   (lVar11 + *(long *)&(this->c).
                                       super__Vector_base<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>,_std::allocator<std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[iVar2].
                                       super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                                       ._M_impl));
      }
    }
    local_78 = (Expression)ZEXT816(0);
    if (bVar17 && (bVar1 & 1U) == 0) {
      i_ot = *(Expression *)
              (*(long *)&(pvVar8->
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                         _M_impl.super__Vector_impl_data + 0x10);
      i_ft.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
      super__Vector_impl_data._M_start = &i_ot;
      i_ft.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x3;
      local_78 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                           ((initializer_list<dynet::Expression> *)&i_ft);
    }
    else {
      i_ot = *(Expression *)
              (*(long *)&(pvVar8->
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                         _M_impl.super__Vector_impl_data + 0x10);
      __l._M_len = 3;
      __l._M_array = &i_ot;
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                (&i_ft,__l,(allocator_type *)&ph_t);
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::reserve
                (&i_ft,(long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish +
                       (3 - (long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_start));
      uVar12 = 0;
      while( true ) {
        uVar9 = (ulong)uVar12;
        if ((ulong)((long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= uVar9) break;
        uVar16 = this->N - 1;
        if (uVar12 < this->N) {
          uVar16 = uVar12;
        }
        i_ot = Lookup(this,(uint)uVar10,0,uVar16);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::
        emplace_back<dynet::Expression>(&i_ft,&i_ot);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                  (&i_ft,i_h_children.
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar9);
        uVar10 = local_100;
        i_ot = Lookup(this,(uint)local_100,4,uVar16);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::
        emplace_back<dynet::Expression>(&i_ft,&i_ot);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                  (&i_ft,i_c_children.
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                         _M_impl.super__Vector_impl_data._M_start + uVar9);
        uVar12 = uVar12 + 1;
      }
      local_78 = detail::
                 f<dynet::AffineTransform,std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
                           ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                            &i_ft.
                             super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                           );
      std::_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>::~_Vector_base
                (&i_ft.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>);
    }
    i_it = logistic(&local_78);
    i_ft.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    i_ft.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    i_ft.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    uVar9 = 0;
    while( true ) {
      uVar12 = (uint)uVar9;
      if ((ulong)((long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 2) <= uVar9) break;
      uVar16 = this->N - 1;
      if (uVar12 < this->N) {
        uVar16 = uVar12;
      }
      local_118 = (Expression)ZEXT816(0);
      if (bVar17 && (bVar1 & 1U) == 0) {
        i_ot = *(Expression *)
                (*(long *)&(pvVar8->
                           super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                           )._M_impl.super__Vector_impl_data + 0x30);
        ph_t.i = 3;
        ph_t.graph_id = 0;
        ph_t.pg = (ComputationGraph *)&i_ot;
        local_118 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                              ((initializer_list<dynet::Expression> *)&ph_t);
      }
      else {
        i_ot = *(Expression *)
                (*(long *)&(pvVar8->
                           super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>
                           )._M_impl.super__Vector_impl_data + 0x30);
        __l_00._M_len = 3;
        __l_00._M_array = (iterator)&i_ot;
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                  ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&ph_t,__l_00,
                   (allocator_type *)&i_wt);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::reserve
                  ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&ph_t,
                   (long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_finish +
                   (3 - (long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start));
        uVar13 = 0;
        while( true ) {
          uVar10 = (ulong)uVar13;
          if ((ulong)((long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2) <= uVar10) break;
          uVar3 = this->N;
          uVar15 = uVar3 - 1;
          if (uVar13 < uVar3) {
            uVar15 = uVar13;
          }
          i_ot = Lookup(this,(uint)local_100,1,uVar3 * uVar15 + uVar16);
          std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::
          emplace_back<dynet::Expression>
                    ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&ph_t,&i_ot);
          std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                    ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&ph_t,
                     i_h_children.
                     super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar10);
          i_ot = Lookup(this,(uint)local_100,5,uVar15 * this->N + uVar16);
          std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::
          emplace_back<dynet::Expression>
                    ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&ph_t,&i_ot);
          std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                    ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&ph_t,
                     i_c_children.
                     super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar10);
          uVar13 = uVar13 + 1;
        }
        local_118 = detail::
                    f<dynet::AffineTransform,std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
                              ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)
                               &ph_t);
        std::_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>::~_Vector_base
                  ((_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_> *)&ph_t);
      }
      ph_t = operator+(&local_118,1.0);
      uVar10 = local_100;
      i_ot = logistic(&ph_t);
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::
      emplace_back<dynet::Expression>(&i_ft,&i_ot);
      uVar9 = (ulong)(uVar12 + 1);
    }
    local_118 = (Expression)ZEXT816(0);
    uVar12 = (uint)uVar10;
    if (bVar17 && (bVar1 & 1U) == 0) {
      i_ot = *(Expression *)
              (*(long *)&(pvVar8->
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                         _M_impl.super__Vector_impl_data + 0x70);
      ph_t.i = 3;
      ph_t.graph_id = 0;
      ph_t.pg = (ComputationGraph *)&i_ot;
      local_118 = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                            ((initializer_list<dynet::Expression> *)&ph_t);
      uVar18 = extraout_XMM0_Da;
      uVar19 = extraout_XMM0_Db;
    }
    else {
      i_ot = *(Expression *)
              (*(long *)&(pvVar8->
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                         _M_impl.super__Vector_impl_data + 0x70);
      __l_01._M_len = 3;
      __l_01._M_array = (iterator)&i_ot;
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&ph_t,__l_01,
                 (allocator_type *)&i_wt);
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::reserve
                ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&ph_t,
                 ((long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 1) + 3);
      for (uVar16 = 0;
          (ulong)uVar16 <
          (ulong)((long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 2); uVar16 = uVar16 + 1) {
        uVar13 = this->N - 1;
        if (uVar16 < this->N) {
          uVar13 = uVar16;
        }
        i_ot = Lookup(this,uVar12,3,uVar13);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::
        emplace_back<dynet::Expression>
                  ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&ph_t,&i_ot);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                  ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&ph_t,
                   i_h_children.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_start + uVar16);
      }
      local_118 = detail::
                  f<dynet::AffineTransform,std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
                            ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&ph_t)
      ;
      std::_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>::~_Vector_base
                ((_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_> *)&ph_t);
      uVar18 = extraout_XMM0_Da_00;
      uVar19 = extraout_XMM0_Db_00;
    }
    tanh((double)CONCAT44(uVar19,uVar18));
    if (bVar17 && (bVar1 & 1U) == 0) {
      EVar20 = cmult(&i_it,&i_wt);
      pEVar6 = pvVar4[-1].super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pEVar6[uVar10].pg = EVar20.pg;
      pEVar6 = pEVar6 + uVar10;
      pEVar6->i = (int)EVar20._8_8_;
      pEVar6->graph_id = (int)((ulong)EVar20._8_8_ >> 0x20);
      i_crt = (Expression)ZEXT816(0);
      i_ot = *(Expression *)
              (*(long *)&(pvVar8->
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                         _M_impl.super__Vector_impl_data + 0x50);
      ph_t.i = 3;
      ph_t.graph_id = 0;
      ph_t.pg = (ComputationGraph *)&i_ot;
      i_crt = detail::f<dynet::AffineTransform,std::initializer_list<dynet::Expression>>
                        ((initializer_list<dynet::Expression> *)&ph_t);
    }
    else {
      ph_t = cmult(&i_it,&i_wt);
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&i_ot,
                 (long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start >> 2,(allocator_type *)&i_crt);
      for (uVar16 = 0; uVar9 = (ulong)uVar16,
          uVar9 < (ulong)((long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_finish -
                          (long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                super__Vector_impl_data._M_start >> 2); uVar16 = uVar16 + 1) {
        EVar20 = cmult(i_ft.
                       super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar9,
                       i_c_children.
                       super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
                       _M_impl.super__Vector_impl_data._M_start + uVar9);
        (&((i_ot.pg)->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
          _M_impl.super__Vector_impl_data._M_start)[uVar9 * 2] = (pointer)EVar20.pg;
        (&((i_ot.pg)->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
          _M_impl.super__Vector_impl_data._M_finish)[uVar9 * 2] = EVar20._8_8_;
      }
      i_crt = detail::f<dynet::Sum,std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
                        ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&i_ot);
      EVar20 = operator+(&i_crt,&ph_t);
      pEVar6 = pvVar4[-1].super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pEVar6[uVar10].pg = EVar20.pg;
      pEVar6 = pEVar6 + uVar10;
      pEVar6->i = (int)EVar20._8_8_;
      pEVar6->graph_id = (int)((ulong)EVar20._8_8_ >> 0x20);
      std::_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>::~_Vector_base
                ((_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_> *)&i_ot);
      i_crt = (Expression)ZEXT816(0);
      i_ot = *(Expression *)
              (*(long *)&(pvVar8->
                         super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>).
                         _M_impl.super__Vector_impl_data + 0x50);
      __l_02._M_len = 3;
      __l_02._M_array = (iterator)&i_ot;
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::vector
                ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&ph_t,__l_02,
                 &local_131);
      std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::reserve
                ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&ph_t,
                 (long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish +
                 (3 - (long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start));
      uVar16 = 0;
      while( true ) {
        uVar9 = (ulong)uVar16;
        if ((ulong)((long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)(children->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start >> 2) <= uVar9) break;
        uVar13 = this->N - 1;
        if (uVar16 < this->N) {
          uVar13 = uVar16;
        }
        i_ot = Lookup(this,uVar12,2,uVar13);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::
        emplace_back<dynet::Expression>
                  ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&ph_t,&i_ot);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                  ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&ph_t,
                   i_h_children.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_start + uVar9);
        i_ot = Lookup(this,uVar12,6,uVar13);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::
        emplace_back<dynet::Expression>
                  ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&ph_t,&i_ot);
        std::vector<dynet::Expression,_std::allocator<dynet::Expression>_>::push_back
                  ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&ph_t,
                   i_c_children.
                   super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>._M_impl
                   .super__Vector_impl_data._M_start + uVar9);
        uVar16 = uVar16 + 1;
      }
      i_crt = detail::
              f<dynet::AffineTransform,std::vector<dynet::Expression,std::allocator<dynet::Expression>>>
                        ((vector<dynet::Expression,_std::allocator<dynet::Expression>_> *)&ph_t);
      std::_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>::~_Vector_base
                ((_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_> *)&ph_t);
    }
    i_ot = logistic(&i_crt);
    tanh((double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01));
    ph_t.i = (int)extraout_RDX;
    ph_t.graph_id = (int)((ulong)extraout_RDX >> 0x20);
    ph_t.pg = extraout_RAX;
    EVar20 = cmult(&i_ot,&ph_t);
    pEVar6 = local_68[-1].super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pEVar6[uVar10].pg = EVar20.pg;
    pEVar6 = pEVar6 + uVar10;
    pEVar6->i = (int)EVar20._8_8_;
    pEVar6->graph_id = (int)((ulong)EVar20._8_8_ >> 0x20);
    std::_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>::~_Vector_base
              (&i_ft.super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>);
    std::_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>::~_Vector_base
              (&i_c_children.
                super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>);
    std::_Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>::~_Vector_base
              (&i_h_children.
                super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>);
  }
  return local_68[-1].super__Vector_base<dynet::Expression,_std::allocator<dynet::Expression>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1];
}

Assistant:

Expression NaryTreeLSTMBuilder::add_input(int id, vector<int> children, const Expression& x) {
  DYNET_ASSERT(id >= 0 && h.size() == (unsigned)id, "Failed dimension check in TreeLSTMBuilder");
  DYNET_ASSERT(id >= 0 && c.size() == (unsigned)id, "Failed dimension check in TreeLSTMBuilder");
  h.push_back(vector<Expression>(layers));
  c.push_back(vector<Expression>(layers));
  vector<Expression>& ht = h.back();
  vector<Expression>& ct = c.back();

  Expression in = x;
  for (unsigned i = 0; i < layers; ++i) {
    const vector<Expression>& vars = param_vars[i];
    vector<Expression> i_h_children, i_c_children;
    i_h_children.reserve(children.size() > 1 ? children.size() : 1);
    i_c_children.reserve(children.size() > 1 ? children.size() : 1);

    bool has_prev_state = (children.size() > 0 || has_initial_state);
    if (children.size() == 0) {
      i_h_children.push_back(Expression());
      i_c_children.push_back(Expression());
      if (has_initial_state) {
        // intial value for h and c at timestep 0 in layer i
        // defaults to zero matrix input if not set in add_parameter_edges
        i_h_children[0] = h0[i];
        i_c_children[0] = c0[i];
      }
    }
    else {  // t > 0
      for (int child : children) {
        i_h_children.push_back(h[child][i]);
        i_c_children.push_back(c[child][i]);
      }
    }

    // input
    Expression i_ait;
    if (has_prev_state) {
      vector<Expression> xs = {vars[BI], vars[X2I], in};
      xs.reserve(4 * children.size() + 3);
      for (unsigned j = 0; j < children.size(); ++j) {
        unsigned ej = (j < N) ? j : N - 1;
        xs.push_back(Lookup(i, H2I, ej));
        xs.push_back(i_h_children[j]);
        xs.push_back(Lookup(i, C2I, ej));
        xs.push_back(i_c_children[j]);
      }
      DYNET_ASSERT(xs.size() == 4 * children.size() + 3, "Failed dimension check in TreeLSTMBuilder");
      i_ait = affine_transform(xs);
    }
    else
      i_ait = affine_transform({vars[BI], vars[X2I], in});
    Expression i_it = logistic(i_ait);

    // forget
    vector<Expression> i_ft;
    for (unsigned k = 0; k < children.size(); ++k) {
      unsigned ek = (k < N) ? k : N - 1;
      Expression i_aft;
      if (has_prev_state) {
        vector<Expression> xs = {vars[BF], vars[X2F], in};
        xs.reserve(4 * children.size() + 3);
        for (unsigned j = 0; j < children.size(); ++j) {
          unsigned ej = (j < N) ? j : N - 1;
          xs.push_back(Lookup(i, H2F, ej * N + ek));
          xs.push_back(i_h_children[j]);
          xs.push_back(Lookup(i, C2F, ej * N + ek));
          xs.push_back(i_c_children[j]);
        }
        DYNET_ASSERT(xs.size() == 4 * children.size() + 3, "Failed dimension check in TreeLSTMBuilder");
        i_aft = affine_transform(xs);
      }
      else
        i_aft = affine_transform({vars[BF], vars[X2F], in});
      i_ft.push_back(logistic(i_aft + 1.f));
    }

    // write memory cell
    Expression i_awt;
    if (has_prev_state) {
      vector<Expression> xs = {vars[BC], vars[X2C], in};
      // This is the one and only place that should *not* condition on i_c_children
      // This should condition only on x (a.k.a. in), the bias (vars[BC]) and i_h_children
      xs.reserve(2 * children.size() + 3);
      for (unsigned j = 0; j < children.size(); ++j) {
        unsigned ej = (j < N) ? j : N - 1;
        xs.push_back(Lookup(i, H2C, ej));
        xs.push_back(i_h_children[j]);
      }
      DYNET_ASSERT(xs.size() == 2 * children.size() + 3, "Failed dimension check in TreeLSTMBuilder");
      i_awt = affine_transform(xs);
    }
    else
      i_awt = affine_transform({vars[BC], vars[X2C], in});
    Expression i_wt = tanh(i_awt);

    // compute new cell value
    if (has_prev_state) {
      Expression i_nwt = cmult(i_it, i_wt);
      vector<Expression> i_crts(children.size());
      for (unsigned j = 0; j < children.size(); ++j) {
        i_crts[j] = cmult(i_ft[j], i_c_children[j]);
      }
      Expression i_crt = sum(i_crts);
      ct[i] = i_crt + i_nwt;
    }
    else {
      ct[i] = cmult(i_it, i_wt);
    }

    // output
    Expression i_aot;
    if (has_prev_state) {
      vector<Expression> xs = {vars[BO], vars[X2O], in};
      xs.reserve(4 * children.size() + 3);
      for (unsigned j = 0; j < children.size(); ++j) {
        unsigned ej = (j < N) ? j : N - 1;
        xs.push_back(Lookup(i, H2O, ej));
        xs.push_back(i_h_children[j]);
        xs.push_back(Lookup(i, C2O, ej));
        xs.push_back(i_c_children[j]);
      }
      DYNET_ASSERT(xs.size() == 4 * children.size() + 3, "Failed dimension check in TreeLSTMBuilder");
      i_aot = affine_transform(xs);
    }
    else
      i_aot = affine_transform({vars[BO], vars[X2O], in});
    Expression i_ot = logistic(i_aot);

    // Compute new h value
    Expression ph_t = tanh(ct[i]);
    in = ht[i] = cmult(i_ot, ph_t);
  }
  return ht.back();
}